

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_pow22523.c
# Opt level: O2

void crypto_sign_ed25519_ref10_fe_pow22523(int32_t *out,int32_t *z)

{
  int iVar1;
  bool bVar2;
  fe t1;
  fe t0;
  fe t2;
  
  crypto_sign_ed25519_ref10_fe_sq(t0,z);
  crypto_sign_ed25519_ref10_fe_sq(t1,t0);
  crypto_sign_ed25519_ref10_fe_sq(t1,t1);
  crypto_sign_ed25519_ref10_fe_mul(t1,z,t1);
  crypto_sign_ed25519_ref10_fe_mul(t0,t0,t1);
  crypto_sign_ed25519_ref10_fe_sq(t0,t0);
  crypto_sign_ed25519_ref10_fe_mul(t0,t1,t0);
  crypto_sign_ed25519_ref10_fe_sq(t1,t0);
  iVar1 = 4;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    crypto_sign_ed25519_ref10_fe_sq(t1,t1);
  }
  crypto_sign_ed25519_ref10_fe_mul(t0,t1,t0);
  crypto_sign_ed25519_ref10_fe_sq(t1,t0);
  iVar1 = 9;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    crypto_sign_ed25519_ref10_fe_sq(t1,t1);
  }
  crypto_sign_ed25519_ref10_fe_mul(t1,t1,t0);
  crypto_sign_ed25519_ref10_fe_sq(t2,t1);
  iVar1 = 0x13;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    crypto_sign_ed25519_ref10_fe_sq(t2,t2);
  }
  crypto_sign_ed25519_ref10_fe_mul(t1,t2,t1);
  crypto_sign_ed25519_ref10_fe_sq(t1,t1);
  iVar1 = 9;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    crypto_sign_ed25519_ref10_fe_sq(t1,t1);
  }
  crypto_sign_ed25519_ref10_fe_mul(t0,t1,t0);
  crypto_sign_ed25519_ref10_fe_sq(t1,t0);
  iVar1 = 0x31;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    crypto_sign_ed25519_ref10_fe_sq(t1,t1);
  }
  crypto_sign_ed25519_ref10_fe_mul(t1,t1,t0);
  crypto_sign_ed25519_ref10_fe_sq(t2,t1);
  iVar1 = 99;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    crypto_sign_ed25519_ref10_fe_sq(t2,t2);
  }
  crypto_sign_ed25519_ref10_fe_mul(t1,t2,t1);
  crypto_sign_ed25519_ref10_fe_sq(t1,t1);
  iVar1 = 0x31;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    crypto_sign_ed25519_ref10_fe_sq(t1,t1);
  }
  crypto_sign_ed25519_ref10_fe_mul(t0,t1,t0);
  crypto_sign_ed25519_ref10_fe_sq(t0,t0);
  crypto_sign_ed25519_ref10_fe_sq(t0,t0);
  crypto_sign_ed25519_ref10_fe_mul(out,t0,z);
  return;
}

Assistant:

void fe_pow22523(fe out,const fe z)
{
  fe t0;
  fe t1;
  fe t2;
  int i;

#include "pow22523.h"

  return;
}